

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O2

void __thiscall
kratos::PackedStruct::PackedStruct
          (PackedStruct *this,string *struct_name,
          vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
          *attributes)

{
  pointer ptVar1;
  pointer ptVar2;
  PackedStructFieldDef local_68;
  PackedStruct *local_38;
  
  std::__cxx11::string::string((string *)this,(string *)struct_name);
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = 0;
  *(undefined8 *)
   ((long)&(this->attributes).
           super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 1) = 0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->attributes).
  super__Vector_base<kratos::PackedStructFieldDef,_std::allocator<kratos::PackedStructFieldDef>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ptVar1 = (attributes->
           super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_38 = this;
  for (ptVar2 = (attributes->
                super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>_>_>
                )._M_impl.super__Vector_impl_data._M_start; ptVar2 != ptVar1; ptVar2 = ptVar2 + 1) {
    local_68.struct_ = (PackedStruct *)0x0;
    local_68.name.field_2._M_allocated_capacity = 0;
    local_68.name.field_2._8_8_ = 0;
    local_68.name._M_string_length = 0;
    local_68._32_8_ =
         (ulong)(ptVar2->
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
                ).super__Tuple_impl<1UL,_unsigned_int,_bool>.super__Tuple_impl<2UL,_bool>.
                super__Head_base<2UL,_bool,_false>._M_head_impl << 0x20;
    local_68.name._M_dataplus._M_p = (pointer)&local_68.name.field_2;
    std::__cxx11::string::_M_assign((string *)&local_68);
    local_68.width =
         (ptVar2->
         super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_bool>
         ).super__Tuple_impl<1UL,_unsigned_int,_bool>.super__Head_base<1UL,_unsigned_int,_false>.
         _M_head_impl;
    std::vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>>::
    emplace_back<kratos::PackedStructFieldDef&>
              ((vector<kratos::PackedStructFieldDef,std::allocator<kratos::PackedStructFieldDef>> *)
               &this->attributes,&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  return;
}

Assistant:

PackedStruct::PackedStruct(std::string struct_name,
                           const std::vector<std::tuple<std::string, uint32_t, bool>> &attributes)
    : struct_name(std::move(struct_name)) {
    for (auto const &[name, size, signed_] : attributes) {
        auto def = PackedStructFieldDef();
        def.signed_ = signed_;
        def.name = name;
        def.width = size;
        this->attributes.emplace_back(def);
    }
}